

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGridHeader.cpp
# Opt level: O2

void __thiscall PatternGridHeader::contextMenuEvent(PatternGridHeader *this,QContextMenuEvent *evt)

{
  int iVar1;
  QPoint *this_00;
  void **ppvVar2;
  undefined4 *puVar3;
  offset_in_QAction_to_subr signal;
  undefined8 in_stack_ffffffffffffff78;
  uint uVar5;
  int *piVar4;
  QArrayDataPointer<char16_t> local_68;
  QContextMenuEvent *local_50;
  Object local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  
  uVar5 = (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  this_00 = (QPoint *)operator_new(0x28);
  QMenu::QMenu((QMenu *)this_00,&this->super_QWidget);
  QWidget::setAttribute((WidgetAttribute)this_00,true);
  iVar1 = this->mTrackHover;
  if (iVar1 != -1) {
    local_50 = evt;
    toggleChannelString((QString *)&local_68,iVar1 + 1);
    ppvVar2 = (void **)QMenu::addAction((QString *)this_00);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    local_68.d = (Data *)QAction::triggered;
    local_68.ptr = (char16_t *)0x0;
    puVar3 = (undefined4 *)operator_new(0x20);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/widgets/grid/PatternGridHeader.cpp:172:13),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(PatternGridHeader **)(puVar3 + 4) = this;
    puVar3[6] = iVar1;
    piVar4 = (int *)((ulong)uVar5 << 0x20);
    QObject::connectImpl
              (local_38,ppvVar2,(QObject *)&local_68,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar3,piVar4,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_38);
    soloChannelString((QString *)&local_68,iVar1 + 1);
    ppvVar2 = (void **)QMenu::addAction((QString *)this_00);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    local_68.d = (Data *)QAction::triggered;
    local_68.ptr = (char16_t *)0x0;
    puVar3 = (undefined4 *)operator_new(0x20);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/widgets/grid/PatternGridHeader.cpp:177:13),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(PatternGridHeader **)(puVar3 + 4) = this;
    puVar3[6] = iVar1;
    QObject::connectImpl
              (local_40,ppvVar2,(QObject *)&local_68,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar3,(int *)((ulong)piVar4 & 0xffffffff00000000),(QMetaObject *)0x0
              );
    QMetaObject::Connection::~Connection((Connection *)local_40);
    QMenu::addSeparator();
    evt = local_50;
  }
  tr((QString *)&local_68,"Unmute all channels",(char *)0x0,-1);
  signal = QMenu::addAction((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  local_68.d = (Data *)unmuteAll;
  local_68.ptr = (char16_t *)0x0;
  QObject::connect<void(QAction::*)(bool),void(PatternGridHeader::*)()>
            (local_48,signal,(Object *)QAction::triggered,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  QMenu::popup(this_00,(QAction *)(evt + 0x30));
  return;
}

Assistant:

void PatternGridHeader::contextMenuEvent(QContextMenuEvent *evt) {
    auto menu = new QMenu(this);
    menu->setAttribute(Qt::WA_DeleteOnClose);

    QAction *act;

    if (mTrackHover != HOVER_NONE) {
        // add actions for the current track
        auto channelNum = mTrackHover + 1;
        auto trackHover = mTrackHover;
        act = menu->addAction(toggleChannelString(channelNum));
        connect(act, &QAction::triggered, this,
            [this, trackHover]() {
                toggleTrack(trackHover);
            });
        act = menu->addAction(soloChannelString(channelNum));
        connect(act, &QAction::triggered, this,
            [this, trackHover]() {
                soloTrack(trackHover);
            });
        menu->addSeparator();
    }

    act = menu->addAction(tr("Unmute all channels"));
    connect(act, &QAction::triggered, this, &PatternGridHeader::unmuteAll);

    menu->popup(evt->globalPos());
}